

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_CCtxPool * ZSTDMT_createCCtxPool(int nbWorkers,ZSTD_customMem cMem)

{
  ZSTD_customMem customMem;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ZSTD_CCtx *pZVar4;
  ZSTD_customMem *pZVar5;
  ZSTDMT_CCtxPool *cctxPool;
  pthread_mutex_t *ppStack_10;
  int nbWorkers_local;
  
  pZVar5 = &cMem;
  ppStack_10 = (pthread_mutex_t *)ZSTD_calloc((long)(nbWorkers + -1) * 8 + 0x50,cMem);
  if (nbWorkers < 1) {
    __assert_fail("nbWorkers > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4bcd,"ZSTDMT_CCtxPool *ZSTDMT_createCCtxPool(int, ZSTD_customMem)");
  }
  if (ppStack_10 == (pthread_mutex_t *)0x0) {
    ppStack_10 = (pthread_mutex_t *)0x0;
  }
  else {
    iVar3 = pthread_mutex_init(ppStack_10,(pthread_mutexattr_t *)0x0);
    if (iVar3 == 0) {
      *(ZSTD_allocFunction *)((long)ppStack_10 + 0x30) = pZVar5->customAlloc;
      *(ZSTD_freeFunction *)((long)ppStack_10 + 0x38) = pZVar5->customFree;
      *(void **)((long)ppStack_10 + 0x40) = pZVar5->opaque;
      ppStack_10[1].__data.__lock = nbWorkers;
      *(undefined4 *)((long)ppStack_10 + 0x2c) = 1;
      uVar1 = pZVar5->customFree;
      uVar2 = pZVar5->opaque;
      customMem.customFree = (ZSTD_freeFunction)uVar2;
      customMem.customAlloc = (ZSTD_allocFunction)uVar1;
      customMem.opaque = pZVar5;
      pZVar4 = ZSTD_createCCtx_advanced(customMem);
      *(ZSTD_CCtx **)((long)ppStack_10 + 0x48) = pZVar4;
      if (*(long *)((long)ppStack_10 + 0x48) == 0) {
        ZSTDMT_freeCCtxPool((ZSTDMT_CCtxPool *)&ppStack_10->__data);
        ppStack_10 = (pthread_mutex_t *)0x0;
      }
    }
    else {
      ZSTD_free(ppStack_10,*pZVar5);
      ppStack_10 = (pthread_mutex_t *)0x0;
    }
  }
  return (ZSTDMT_CCtxPool *)ppStack_10;
}

Assistant:

static ZSTDMT_CCtxPool* ZSTDMT_createCCtxPool(int nbWorkers,
                                              ZSTD_customMem cMem)
{
    ZSTDMT_CCtxPool* const cctxPool = (ZSTDMT_CCtxPool*) ZSTD_calloc(
        sizeof(ZSTDMT_CCtxPool) + (nbWorkers-1)*sizeof(ZSTD_CCtx*), cMem);
    assert(nbWorkers > 0);
    if (!cctxPool) return NULL;
    if (ZSTD_pthread_mutex_init(&cctxPool->poolMutex, NULL)) {
        ZSTD_free(cctxPool, cMem);
        return NULL;
    }
    cctxPool->cMem = cMem;
    cctxPool->totalCCtx = nbWorkers;
    cctxPool->availCCtx = 1;   /* at least one cctx for single-thread mode */
    cctxPool->cctx[0] = ZSTD_createCCtx_advanced(cMem);
    if (!cctxPool->cctx[0]) { ZSTDMT_freeCCtxPool(cctxPool); return NULL; }
    DEBUGLOG(3, "cctxPool created, with %u workers", nbWorkers);
    return cctxPool;
}